

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O2

CURLcode Curl_cf_haproxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  cf_haproxy_ctx *ctx;
  cf_haproxy_ctx *ctx_00;
  Curl_cfilter *cf;
  
  cf = (Curl_cfilter *)0x0;
  ctx = (cf_haproxy_ctx *)(*Curl_ccalloc)(1,0x28);
  if (ctx == (cf_haproxy_ctx *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    ctx_00 = (cf_haproxy_ctx *)0x0;
  }
  else {
    ctx->state = 0;
    Curl_dyn_init(&ctx->data_out,0x800);
    CVar1 = Curl_cf_create(&cf,&Curl_cft_haproxy,ctx);
    ctx_00 = (cf_haproxy_ctx *)0x0;
    if (CVar1 != CURLE_OK) {
      ctx_00 = ctx;
    }
  }
  cf_haproxy_ctx_free(ctx_00);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,cf);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_haproxy_insert_after(struct Curl_cfilter *cf_at,
                                      struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_haproxy_create(&cf, data);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  return result;
}